

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::QuantizationParams::SerializeWithCachedSizes
          (QuantizationParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint64 uVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  QuantizationParams *this_local;
  
  uVar2 = numberofbits(this);
  if (uVar2 != 0) {
    uVar2 = numberofbits(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar2,output);
  }
  bVar1 = has_linearquantization(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->QuantizationType_).linearquantization_)->super_MessageLite,output);
  }
  bVar1 = has_lookuptablequantization(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x66,&((this->QuantizationType_).linearquantization_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void QuantizationParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.QuantizationParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 numberOfBits = 1;
  if (this->numberofbits() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->numberofbits(), output);
  }

  // .CoreML.Specification.LinearQuantizationParams linearQuantization = 101;
  if (has_linearquantization()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *QuantizationType_.linearquantization_, output);
  }

  // .CoreML.Specification.LookUpTableQuantizationParams lookupTableQuantization = 102;
  if (has_lookuptablequantization()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      102, *QuantizationType_.lookuptablequantization_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.QuantizationParams)
}